

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O1

int cubeb_stream_init(cubeb *context,cubeb_stream **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency,cubeb_data_callback data_callback,
                     cubeb_state_callback state_callback,void *user_ptr)

{
  undefined4 in_EAX;
  int iVar1;
  cubeb_log_level cVar2;
  int extraout_EAX;
  cubeb_stream_params *pcVar3;
  cubeb_log_callback p_Var4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  
  auVar9._0_4_ = -(uint)(context == (cubeb *)0x0);
  auVar9._4_4_ = -(uint)(stream == (cubeb_stream **)0x0);
  auVar9._8_4_ = -(uint)(data_callback == (cubeb_data_callback)0x0);
  auVar9._12_4_ = -(uint)(state_callback == (cubeb_state_callback)0x0);
  iVar1 = movmskps(in_EAX,auVar9);
  iVar5 = -3;
  if (iVar1 == 0) {
    if (input_stream_params == (cubeb_stream_params *)0x0 &&
        output_stream_params == (cubeb_stream_params *)0x0) {
      cubeb_stream_init_cold_1();
      if (context != (cubeb *)0x0) {
        iVar1 = (**(code **)(context->ops->init + 0x50))();
        return iVar1;
      }
      return extraout_EAX;
    }
    if ((((output_stream_params == (cubeb_stream_params *)0x0) ||
         ((iVar5 = -2, 0xfff44be6 < output_stream_params->rate - 0xbb801 &&
          (0xffffff00 < output_stream_params->channels - 0x100)))) &&
        ((input_stream_params == (cubeb_stream_params *)0x0 ||
         ((iVar5 = -2, 0xfff44be6 < input_stream_params->rate - 0xbb801 &&
          (0xffffff00 < input_stream_params->channels - 0x100)))))) &&
       ((input_stream_params == (cubeb_stream_params *)0x0 ||
         output_stream_params == (cubeb_stream_params *)0x0 ||
        ((iVar5 = -2, input_stream_params->rate == output_stream_params->rate &&
         (input_stream_params->format == output_stream_params->format)))))) {
      pcVar3 = output_stream_params;
      if (input_stream_params != (cubeb_stream_params *)0x0) {
        pcVar3 = input_stream_params;
      }
      iVar5 = (uint)(pcVar3->format < 4) * 2 + -2;
    }
    if (iVar5 == 0) {
      bVar8 = latency - 1 < 96000;
      if (bVar8) {
        iVar5 = (*context->ops->stream_init)
                          (context,stream,stream_name,input_device,input_stream_params,output_device
                           ,output_stream_params,latency,data_callback,state_callback,user_ptr);
        if (iVar5 == -2) {
          cVar2 = cubeb_log_get_level();
          if (cVar2 != CUBEB_LOG_DISABLED) {
            p_Var4 = cubeb_log_get_callback();
            if (p_Var4 != (cubeb_log_callback)0x0) {
              uVar7 = 0;
              uVar6 = 0;
              if (output_stream_params != (cubeb_stream_params *)0x0) {
                uVar6 = (ulong)(output_stream_params->format != CUBEB_SAMPLE_S16LE);
              }
              if (input_stream_params != (cubeb_stream_params *)0x0) {
                uVar7 = (ulong)(input_stream_params->format != CUBEB_SAMPLE_S16LE);
              }
              cubeb_log_internal("cubeb.c",0x191,"Invalid format, %p %p %d %d",output_stream_params,
                                 input_stream_params,uVar6,uVar7);
            }
          }
        }
      }
      else {
        iVar5 = (uint)bVar8 * 3 + -3;
      }
    }
  }
  return iVar5;
}

Assistant:

int
cubeb_stream_init(cubeb * context, cubeb_stream ** stream,
                  char const * stream_name, cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency, cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback, void * user_ptr)
{
  int r;

  if (!context || !stream || !data_callback || !state_callback) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if ((r = validate_stream_params(input_stream_params, output_stream_params)) !=
          CUBEB_OK ||
      (r = validate_latency(latency)) != CUBEB_OK) {
    return r;
  }

  r = context->ops->stream_init(context, stream, stream_name, input_device,
                                input_stream_params, output_device,
                                output_stream_params, latency, data_callback,
                                state_callback, user_ptr);

  if (r == CUBEB_ERROR_INVALID_FORMAT) {
    LOG("Invalid format, %p %p %d %d", output_stream_params,
        input_stream_params,
        output_stream_params && output_stream_params->format,
        input_stream_params && input_stream_params->format);
  }

  return r;
}